

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O3

void * device_start_nesapu(UINT32 clock,UINT32 rate)

{
  undefined8 *puVar1;
  int *piVar2;
  uint *puVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined1 auVar6 [13];
  uint3 uVar7;
  uint5 uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [13];
  nesapu_state *info;
  void *pvVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar20;
  int iVar21;
  undefined1 auVar19 [16];
  int iVar22;
  undefined1 auVar23 [16];
  
  pvVar11 = calloc(1,0x43f0);
  if (pvVar11 != (void *)0x0) {
    *(uint *)((long)pvVar11 + 0xe4) = rate / 0x3c;
    uVar12 = (rate / 0x3c) * 0x3c;
    *(uint *)((long)pvVar11 + 0xec) = uVar12;
    *(float *)((long)pvVar11 + 0xe0) = (float)clock / (float)uVar12;
    uVar12 = 0x11;
    lVar13 = 0;
    do {
      uVar14 = (int)uVar12 >> 1;
      uVar12 = ((uVar12 ^ uVar14) & 1) << 0xc | uVar14;
      *(char *)((long)pvVar11 + lVar13 + 0xf0) = (char)uVar14;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x4000);
    uVar5 = (ulong)rate / 0x3c;
    uVar12 = (uint)uVar5;
    lVar13 = 0;
    do {
      uVar4 = *(undefined4 *)
               (
               "\x05\x7f\n\x01\x13\x02(\x03P\x04\x1e\x05\a\x06\r\a\x06\b\f\t\x18\n0\v`\f$\r\b\x0e\x10\x0f"
               + lVar13);
      auVar6[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar6._0_12_ = ZEXT712(0);
      uVar8 = CONCAT32(auVar6._10_3_,(ushort)(byte)((uint)uVar4 >> 0x10));
      auVar10._5_8_ = 0;
      auVar10._0_5_ = uVar8;
      uVar7 = auVar6._10_3_ >> 0x10;
      auVar9._12_3_ = uVar7;
      auVar9._0_12_ = ZEXT312(uVar7) << 0x40;
      puVar1 = (undefined8 *)((long)pvVar11 + lVar13 * 4 + 0x40f0);
      *puVar1 = CONCAT44((int)((uint)CONCAT72(SUB137(auVar10 << 0x40,6),
                                              (ushort)(byte)((uint)uVar4 >> 8)) * uVar5),
                         (int)(uVar5 * (byte)uVar4));
      *(int *)(puVar1 + 2) = (int)(uVar5 * ((ulong)uVar8 & 0xffffffff));
      *(int *)((long)puVar1 + 0x14) = (int)(((ulong)auVar9._8_7_ & 0xffffffff) * uVar5);
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x20);
    uVar14 = DAT_0017c3f0._4_4_;
    auVar19._4_4_ = uVar14;
    auVar19._0_4_ = uVar14;
    auVar19._8_4_ = DAT_0017c3f0._12_4_;
    auVar19._12_4_ = DAT_0017c3f0._12_4_;
    iVar20 = (int)(uVar14 * uVar5);
    iVar22 = (int)((auVar19._8_8_ & 0xffffffff) * uVar5);
    iVar18 = (int)((uint)DAT_0017c3f0 * uVar5);
    iVar21 = (int)((DAT_0017c3f0._8_8_ & 0xffffffff) * uVar5);
    lVar13 = 0;
    do {
      piVar2 = (int *)((long)pvVar11 + lVar13 * 4 + 0x4170);
      *piVar2 = iVar18;
      piVar2[1] = iVar20;
      piVar2[2] = iVar21;
      piVar2[3] = iVar22;
      lVar13 = lVar13 + 4;
      iVar18 = iVar18 + uVar12 * 4;
      iVar20 = iVar20 + uVar12 * 4;
      iVar21 = iVar21 + uVar12 * 4;
      iVar22 = iVar22 + uVar12 * 4;
    } while (lVar13 != 0x20);
    auVar23._8_4_ = 3;
    auVar23._0_8_ = 0x100000001;
    auVar23._12_4_ = 3;
    uVar17 = (uint)((auVar23._8_8_ & 0xffffffff) * uVar5);
    uVar15 = 0;
    uVar16 = (uint)(uVar5 * 2);
    lVar13 = 0;
    uVar14 = uVar12;
    do {
      puVar3 = (uint *)((long)pvVar11 + lVar13 * 4 + 0x41f0);
      *puVar3 = uVar15 >> 2;
      puVar3[1] = uVar14 >> 2;
      puVar3[2] = uVar16 >> 2;
      puVar3[3] = uVar17 >> 2;
      lVar13 = lVar13 + 4;
      uVar15 = uVar15 + uVar12 * 4;
      uVar14 = uVar14 + uVar12 * 4;
      uVar16 = uVar16 + uVar12 * 4;
      uVar17 = uVar17 + uVar12 * 4;
    } while (lVar13 != 0x80);
    *(uint *)((long)pvVar11 + 0xe8) = uVar12 * 2;
    *(undefined8 *)((long)pvVar11 + 0xa0) = 0;
    *(undefined1 *)((long)pvVar11 + 0x27) = 0;
    *(undefined1 *)((long)pvVar11 + 0x47) = 0;
    *(undefined1 *)((long)pvVar11 + 99) = 0;
    *(undefined1 *)((long)pvVar11 + 0x7e) = 0;
    *(undefined1 *)((long)pvVar11 + 0xaa) = 0;
  }
  return pvVar11;
}

Assistant:

void* device_start_nesapu(UINT32 clock, UINT32 rate)
{
	nesapu_state *info;

	info = (nesapu_state*)calloc(1, sizeof(nesapu_state));
	if (info == NULL)
		return NULL;
	
	/* Initialize global variables */
	info->samps_per_sync = rate / SCREEN_HZ;
	info->buffer_size = info->samps_per_sync;
	info->real_rate = info->samps_per_sync * SCREEN_HZ;
	info->apu_incsize = (float) (clock / (float) info->real_rate);

	/* Use initializer calls */
	create_noise(info->noise_lut, 13, NOISE_LONG);
	create_vbltimes(info->vbl_times,vbl_length,info->samps_per_sync);
	create_syncs(info, info->samps_per_sync);

	/* Adjust buffer size if 16 bits */
	info->buffer_size+=info->samps_per_sync;

	info->APU.dpcm.memory = NULL;

	nesapu_set_mute_mask(info, 0x00);

	return info;
}